

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O3

uint64_t helper_pacia_aarch64(CPUARMState_conflict *env,uint64_t x,uint64_t y)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  uintptr_t unaff_retaddr;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) != 0) {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
    goto LAB_0062ad6b;
  }
  if (env->aarch64 != 0) {
    uVar3 = env->pstate >> 2 & 3;
    goto LAB_0062ad6b;
  }
  uVar3 = env->uncached_cpsr & 0x1f;
  if (uVar3 == 0x10) {
    uVar3 = 0;
    goto LAB_0062ad6b;
  }
  if (uVar3 == 0x16) {
LAB_0062ad66:
    uVar3 = 3;
  }
  else {
    if (uVar3 == 0x1a) {
      uVar3 = 2;
      goto LAB_0062ad6b;
    }
    if ((uVar1 >> 0x21 & 1) != 0) {
      if (uVar3 == 0x16) {
        uVar3 = 3;
        if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0062ad6b;
      }
      else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0062ad66;
    }
    uVar3 = 1;
  }
LAB_0062ad6b:
  uVar2 = arm_sctlr_aarch64(env,uVar3);
  if ((int)uVar2 < 0) {
    pauth_check_trap(env,uVar3,unaff_retaddr);
    uVar2 = pauth_addpac(env,x,y,&(env->keys).apia,false);
    return uVar2;
  }
  return x;
}

Assistant:

uint64_t HELPER(pacia)(CPUARMState *env, uint64_t x, uint64_t y)
{
    int el = arm_current_el(env);
    if (!pauth_key_enabled(env, el, SCTLR_EnIA)) {
        return x;
    }
    pauth_check_trap(env, el, GETPC());
    return pauth_addpac(env, x, y, &env->keys.apia, false);
}